

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  size_type *config;
  allocator local_61;
  string local_60;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_40,"TARGET_SONAME_FILE is not allowed for DLL target platforms.",
               &local_61);
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if (TVar2 == SHARED_LIBRARY) {
      config = &(target->ExportMacro)._M_string_length;
      cmGeneratorTarget::GetDirectory
                (__return_storage_ptr__,(cmGeneratorTarget *)this,(string *)config,false);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmGeneratorTarget::GetSOName(&local_60,(cmGeneratorTarget *)this,(string *)config);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_60);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_40,"TARGET_SONAME_FILE is allowed only for SHARED libraries.",
               &local_61);
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext *context,
                            const GeneratorExpressionContent *content)
  {
    // The target soname file (.so.1).
    if(target->IsDLLPlatform())
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
      }
    if(target->GetType() != cmState::SHARED_LIBRARY)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
      }
    std::string result = target->GetDirectory(context->Config);
    result += "/";
    result += target->GetSOName(context->Config);
    return result;
  }